

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&adata);
  UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
  Vector::ToUnifiedFormat(a,count,&adata);
  Vector::ToUnifiedFormat(b,count,&bdata);
  BinaryUpdateLoop<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
            ((string_t *)adata.data,aggr_input_data,(hugeint_t *)bdata.data,
             (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *)state,count,adata.sel,bdata.sel,
             &adata.validity,&bdata.validity);
  UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}